

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

Maybe<kj::Exception> * __thiscall
kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase41::run()::__0>
          (Maybe<kj::Exception> *__return_storage_ptr__,kj *this,anon_class_8_1_6b0526df *func)

{
  anon_class_8_1_6b0526df *func_local;
  
  ::capnp::_::anon_unknown_0::TestCase41::run::anon_class_8_1_6b0526df::operator()
            ((anon_class_8_1_6b0526df *)this);
  Maybe<kj::Exception>::Maybe(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Maybe<Exception> runCatchingExceptions(Func&& func) {
  try {
    func();
    return kj::none;
  } catch (...) {
    return getCaughtExceptionAsKj();
  }
}